

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O0

void train_skill_over_time(int skill,int weight,int *counter,int fast,int slow,int light,int heavy)

{
  int iVar1;
  int iVar2;
  int offset;
  int expert;
  int tick;
  int divisor;
  int light_local;
  int slow_local;
  int fast_local;
  int *counter_local;
  int weight_local;
  int skill_local;
  
  iVar1 = practice_needed_to_advance(skill,3);
  if (slow == fast) {
    offset = fast / iVar1;
    *counter = *counter + 1;
  }
  else {
    iVar2 = (fast * heavy - slow * light) / ((slow - fast) * 10);
    offset = (slow / iVar1) * (light / 10 + iVar2);
    *counter = weight / 10 + iVar2 + *counter;
  }
  if (offset <= *counter) {
    use_skill(skill,*counter / offset);
    *counter = *counter % offset;
  }
  return;
}

Assistant:

void train_skill_over_time(int skill, int weight, int *counter,
			   int fast, int slow, int light, int heavy)
{
    const int divisor = 10; /* weight divisor, keeps factors low */
    int tick;
    int expert = practice_needed_to_advance(skill, P_EXPERT - 1);

    /*
     * Assumption: slow and fast are either always different or always the same,
     * so running the first branch below in one call and the second on the other
     * is a Bad Idea(tm) since the tick values for each branch are very different.
     */
    if (slow == fast) {
	/* fall back on fast and ignore weight */
	tick = fast / expert;
	*counter += 1;
    } else {
	/*
	 * We want the following equations to apply simultaneously:
	 *
	 *  tick = slow / expert * (light / divisor + offset)
	 *  tick = fast / expert * (heavy / divisor + offset)
	 *
	 * To get offset we equate the two:
	 *
	 *  s / e * (l / d + o) = f / e * (h / d + o)
	 *     sl / de + so / e = fh / de + fo / e
	 *               so / e = (fh - sl) / de + fo / e
	 *                   so = (fh - sl) / d + fo
	 *              so - fo = (fh - sl) / d
	 *             (s - f)o = (fh - sl) / d
	 *                    o = (fh - sl) / (d(s - f))
	 *
	 * The offset can then be substituted into either tick equation.
	 */
	int offset = (fast * heavy - slow * light) / (divisor * (slow - fast));
	tick = slow / expert * (light / divisor + offset);
	*counter += weight / divisor + offset;
    }

    /* Train once for every tick points accumulated in counter. */
    if (*counter >= tick) {
	use_skill(skill, *counter / tick);
	*counter %= tick;
    }
}